

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFile.cc
# Opt level: O3

void __thiscall tt::LogFile::flush(LogFile *this)

{
  pthread_mutex_t *__mutex;
  MutexLockGuard lock;
  
  __mutex = (pthread_mutex_t *)
            (this->m_mutex)._M_t.
            super___uniq_ptr_impl<tt::MutexLock,_std::default_delete<tt::MutexLock>_>._M_t.
            super__Tuple_impl<0UL,_tt::MutexLock_*,_std::default_delete<tt::MutexLock>_>.
            super__Head_base<0UL,_tt::MutexLock_*,_false>._M_head_impl;
  if (__mutex != (pthread_mutex_t *)0x0) {
    pthread_mutex_lock(__mutex);
    FileUtil::AppendFile::flush
              ((this->m_file)._M_t.
               super___uniq_ptr_impl<tt::FileUtil::AppendFile,_std::default_delete<tt::FileUtil::AppendFile>_>
               ._M_t.
               super__Tuple_impl<0UL,_tt::FileUtil::AppendFile_*,_std::default_delete<tt::FileUtil::AppendFile>_>
               .super__Head_base<0UL,_tt::FileUtil::AppendFile_*,_false>._M_head_impl);
    pthread_mutex_unlock(__mutex);
    return;
  }
  FileUtil::AppendFile::flush
            ((this->m_file)._M_t.
             super___uniq_ptr_impl<tt::FileUtil::AppendFile,_std::default_delete<tt::FileUtil::AppendFile>_>
             ._M_t.
             super__Tuple_impl<0UL,_tt::FileUtil::AppendFile_*,_std::default_delete<tt::FileUtil::AppendFile>_>
             .super__Head_base<0UL,_tt::FileUtil::AppendFile_*,_false>._M_head_impl);
  return;
}

Assistant:

void tt::LogFile::flush(){
	if(m_mutex){
		MutexLockGuard lock(*m_mutex);
		m_file->flush();
	}else{
		m_file->flush();
	}
}